

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool ExecuteWitnessScript
               (Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *stack_span,
               CScript *exec_script,uint flags,SigVersion sigversion,BaseSignatureChecker *checker,
               ScriptExecutionData *execdata,ScriptError *serror)

{
  const_iterator x;
  bool bVar1;
  const_iterator this;
  size_type sVar2;
  int in_ECX;
  uint in_EDX;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_00000008;
  valtype *elem;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  opcodetype opcode;
  const_iterator pc;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  ScriptExecutionData *in_stack_000006a0;
  BaseSignatureChecker *in_stack_000006a8;
  uint in_stack_000006b4;
  CScript *in_stack_000006b8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_000006c0;
  SigVersion in_stack_00000bac;
  ScriptError *in_stack_00000e10;
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_stack_ffffffffffffff18
  ;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  const_iterator in_stack_ffffffffffffff30;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff58;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  bool local_49;
  allocator_type local_21 [25];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::begin
            (in_stack_ffffffffffffff18);
  Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::end
            (in_stack_ffffffffffffff18);
  __a = local_21;
  std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
            ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffff18);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,void>
            (in_stack_ffffffffffffff60,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),in_stack_ffffffffffffff58
             ,__a);
  std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
            ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_ffffffffffffff18);
  if (in_ECX == 3) {
    this = prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_ffffffffffffff20);
    do {
      in_stack_ffffffffffffff30 =
           prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffff20);
      x.ptr._4_1_ = in_stack_ffffffffffffff2c;
      x.ptr._0_4_ = in_stack_ffffffffffffff28;
      x.ptr._5_1_ = in_stack_ffffffffffffff2d;
      x.ptr._6_1_ = in_stack_ffffffffffffff2e;
      x.ptr._7_1_ = in_stack_ffffffffffffff2f;
      in_stack_ffffffffffffff2f =
           prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                     ((const_iterator *)in_stack_ffffffffffffff20,x);
      if (!(bool)in_stack_ffffffffffffff2f) {
        sVar2 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)in_stack_ffffffffffffff18);
        if (sVar2 < 0x3e9) goto LAB_008b5db5;
        local_49 = anon_unknown.dwarf_feb727::set_error
                             ((ScriptError *)in_stack_ffffffffffffff18,SCRIPT_ERR_OK);
        goto LAB_008b5f47;
      }
      in_stack_ffffffffffffff2e =
           CScript::GetOp((CScript *)this.ptr,(const_iterator *)in_stack_ffffffffffffff30.ptr,
                          (opcodetype *)
                          CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     CONCAT14(in_stack_ffffffffffffff2c,
                                                              in_stack_ffffffffffffff28)))));
      if (!(bool)in_stack_ffffffffffffff2e) {
        local_49 = anon_unknown.dwarf_feb727::set_error
                             ((ScriptError *)in_stack_ffffffffffffff18,SCRIPT_ERR_OK);
        goto LAB_008b5f47;
      }
      in_stack_ffffffffffffff2d = IsOpSuccess((opcodetype *)in_stack_ffffffffffffff18);
    } while (!(bool)in_stack_ffffffffffffff2d);
    if ((in_EDX & 0x80000) == 0) {
      local_49 = anon_unknown.dwarf_feb727::set_success((ScriptError *)in_stack_ffffffffffffff18);
    }
    else {
      local_49 = anon_unknown.dwarf_feb727::set_error
                           ((ScriptError *)in_stack_ffffffffffffff18,SCRIPT_ERR_OK);
    }
  }
  else {
LAB_008b5db5:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::begin((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_ffffffffffffff20);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::end((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)in_stack_ffffffffffffff20);
    while (bVar1 = __gnu_cxx::
                   operator==<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                             ((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff2f,
                                          CONCAT16(in_stack_ffffffffffffff2e,
                                                   CONCAT15(in_stack_ffffffffffffff2d,
                                                            CONCAT14(in_stack_ffffffffffffff2c,
                                                                     in_stack_ffffffffffffff28)))),
                              (__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                               *)in_stack_ffffffffffffff20), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator*((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)in_stack_ffffffffffffff18);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_ffffffffffffff18);
      if (0x208 < sVar2) {
        local_49 = anon_unknown.dwarf_feb727::set_error
                             ((ScriptError *)in_stack_ffffffffffffff18,SCRIPT_ERR_OK);
        goto LAB_008b5f47;
      }
      __gnu_cxx::
      __normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::operator++((__normal_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)in_stack_ffffffffffffff18);
    }
    in_stack_ffffffffffffff2c =
         EvalScript(in_stack_000006c0,in_stack_000006b8,in_stack_000006b4,in_stack_000006a8,
                    in_stack_00000bac,in_stack_000006a0,in_stack_00000e10);
    if ((bool)in_stack_ffffffffffffff2c) {
      sVar2 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::size(in_stack_00000008);
      if (sVar2 == 1) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::back(in_stack_00000008);
        bVar1 = CastToBool((valtype *)in_stack_ffffffffffffff30.ptr);
        if (bVar1) {
          local_49 = true;
        }
        else {
          local_49 = anon_unknown.dwarf_feb727::set_error
                               ((ScriptError *)in_stack_00000008,SCRIPT_ERR_OK);
        }
      }
      else {
        local_49 = anon_unknown.dwarf_feb727::set_error
                             ((ScriptError *)in_stack_00000008,SCRIPT_ERR_OK);
      }
    }
    else {
      local_49 = false;
    }
  }
LAB_008b5f47:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff2f,
                        CONCAT16(in_stack_ffffffffffffff2e,
                                 CONCAT15(in_stack_ffffffffffffff2d,
                                          CONCAT14(in_stack_ffffffffffffff2c,
                                                   in_stack_ffffffffffffff28)))));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_49;
}

Assistant:

static bool ExecuteWitnessScript(const Span<const valtype>& stack_span, const CScript& exec_script, unsigned int flags, SigVersion sigversion, const BaseSignatureChecker& checker, ScriptExecutionData& execdata, ScriptError* serror)
{
    std::vector<valtype> stack{stack_span.begin(), stack_span.end()};

    if (sigversion == SigVersion::TAPSCRIPT) {
        // OP_SUCCESSx processing overrides everything, including stack element size limits
        CScript::const_iterator pc = exec_script.begin();
        while (pc < exec_script.end()) {
            opcodetype opcode;
            if (!exec_script.GetOp(pc, opcode)) {
                // Note how this condition would not be reached if an unknown OP_SUCCESSx was found
                return set_error(serror, SCRIPT_ERR_BAD_OPCODE);
            }
            // New opcodes will be listed here. May use a different sigversion to modify existing opcodes.
            if (IsOpSuccess(opcode)) {
                if (flags & SCRIPT_VERIFY_DISCOURAGE_OP_SUCCESS) {
                    return set_error(serror, SCRIPT_ERR_DISCOURAGE_OP_SUCCESS);
                }
                return set_success(serror);
            }
        }

        // Tapscript enforces initial stack size limits (altstack is empty here)
        if (stack.size() > MAX_STACK_SIZE) return set_error(serror, SCRIPT_ERR_STACK_SIZE);
    }

    // Disallow stack item size > MAX_SCRIPT_ELEMENT_SIZE in witness stack
    for (const valtype& elem : stack) {
        if (elem.size() > MAX_SCRIPT_ELEMENT_SIZE) return set_error(serror, SCRIPT_ERR_PUSH_SIZE);
    }

    // Run the script interpreter.
    if (!EvalScript(stack, exec_script, flags, checker, sigversion, execdata, serror)) return false;

    // Scripts inside witness implicitly require cleanstack behaviour
    if (stack.size() != 1) return set_error(serror, SCRIPT_ERR_CLEANSTACK);
    if (!CastToBool(stack.back())) return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
    return true;
}